

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_parse.c
# Opt level: O1

ngx_int_t ngx_http_parse_set_cookie_lines(ngx_array_t *headers,ngx_str_t *name,ngx_str_t *value)

{
  u_char *puVar1;
  void *pvVar2;
  ngx_log_t *log;
  long lVar3;
  ulong uVar4;
  u_char *puVar5;
  u_char *puVar6;
  ngx_int_t nVar7;
  u_char *puVar8;
  u_char *puVar9;
  u_char *puVar10;
  ulong uVar11;
  
  if (headers->nelts != 0) {
    pvVar2 = headers->elts;
    uVar11 = 0;
    do {
      log = headers->pool->log;
      if ((log->log_level & 0x100) != 0) {
        lVar3 = *(long *)((long)pvVar2 + uVar11 * 8);
        ngx_log_error_core(8,log,0,"parse header: \"%V: %V\"",lVar3 + 8,lVar3 + 0x18);
      }
      lVar3 = *(long *)((long)pvVar2 + uVar11 * 8);
      uVar4 = *(ulong *)(lVar3 + 0x18);
      if (name->len < uVar4) {
        puVar8 = *(u_char **)(lVar3 + 0x20);
        nVar7 = ngx_strncasecmp(puVar8,name->data,name->len);
        if (nVar7 == 0) {
          puVar1 = puVar8 + uVar4;
          puVar8 = puVar8 + name->len;
          if ((long)name->len < (long)uVar4) {
            do {
              if (*puVar8 != ' ') break;
              puVar8 = puVar8 + 1;
            } while (puVar8 < puVar1);
          }
          if ((puVar8 != puVar1) && (*puVar8 == '=')) {
            puVar6 = puVar8 + 1;
            puVar8 = puVar8 + 1;
            goto LAB_00145a2a;
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < headers->nelts);
  }
  return -5;
  while( true ) {
    puVar6 = puVar9 + 1;
    puVar8 = puVar10 + 1;
    if (*puVar10 != ' ') break;
LAB_00145a2a:
    puVar10 = puVar8;
    puVar9 = puVar6;
    puVar5 = puVar10;
    if (puVar1 <= puVar10) break;
  }
  for (; (puVar5 < puVar1 && (*puVar5 != ';')); puVar5 = puVar5 + 1) {
  }
  value->len = (long)puVar5 - (long)puVar9;
  value->data = puVar10;
  return uVar11;
}

Assistant:

ngx_int_t
ngx_http_parse_set_cookie_lines(ngx_array_t *headers, ngx_str_t *name,
    ngx_str_t *value)
{
    ngx_uint_t         i;
    u_char            *start, *last, *end;
    ngx_table_elt_t  **h;

    h = headers->elts;

    for (i = 0; i < headers->nelts; i++) {

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, headers->pool->log, 0,
                       "parse header: \"%V: %V\"", &h[i]->key, &h[i]->value);

        if (name->len >= h[i]->value.len) {
            continue;
        }

        start = h[i]->value.data;
        end = h[i]->value.data + h[i]->value.len;

        if (ngx_strncasecmp(start, name->data, name->len) != 0) {
            continue;
        }

        for (start += name->len; start < end && *start == ' '; start++) {
            /* void */
        }

        if (start == end || *start++ != '=') {
            /* the invalid header value */
            continue;
        }

        while (start < end && *start == ' ') { start++; }

        for (last = start; last < end && *last != ';'; last++) {
            /* void */
        }

        value->len = last - start;
        value->data = start;

        return i;
    }

    return NGX_DECLINED;
}